

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O0

void __thiscall
duckdb::PhysicalOperator::BuildPipelines
          (PhysicalOperator *this,Pipeline *current,MetaPipeline *meta_pipeline)

{
  bool bVar1;
  MetaPipeline *pMVar2;
  ulong uVar3;
  size_type sVar4;
  InternalException *this_00;
  reference this_01;
  PhysicalOperator *pPVar5;
  MetaPipeline *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  MetaPipeline *child_meta_pipeline;
  PipelineBuildState *state;
  pointer in_stack_ffffffffffffff78;
  PhysicalOperator *in_stack_ffffffffffffff80;
  Pipeline *in_stack_ffffffffffffff88;
  allocator *paVar6;
  PipelineBuildState *in_stack_ffffffffffffff90;
  allocator local_49;
  string local_48 [23];
  MetaPipelineType in_stack_ffffffffffffffcf;
  PhysicalOperator *in_stack_ffffffffffffffd0;
  Pipeline *in_stack_ffffffffffffffd8;
  
  unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>,_true>::
  reset((unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>,_true>
         *)in_stack_ffffffffffffff80,(pointer)in_stack_ffffffffffffff78);
  pMVar2 = (MetaPipeline *)MetaPipeline::GetState(in_RDX);
  uVar3 = (**(code **)(*in_RDI + 0x108))();
  if ((uVar3 & 1) == 0) {
    bVar1 = ::std::
            vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            ::empty((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                     *)in_stack_ffffffffffffff90);
    if (bVar1) {
      PipelineBuildState::SetPipelineSource
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    else {
      sVar4 = ::std::
              vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              ::size((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      *)(in_RDI + 2));
      if (sVar4 != 1) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        paVar6 = &local_49;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_48,"Operator not supported in BuildPipelines",paVar6);
        InternalException::InternalException(this_00,(string *)in_stack_ffffffffffffff78);
        __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
      }
      PipelineBuildState::AddPipelineOperator
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      this_01 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                          ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                           in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
      pPVar5 = ::std::reference_wrapper<duckdb::PhysicalOperator>::get(this_01);
      (*pPVar5->_vptr_PhysicalOperator[0x26])(pPVar5,in_RSI,in_RDX);
    }
  }
  else {
    unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::reset
              ((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    PipelineBuildState::SetPipelineSource
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    pMVar2 = MetaPipeline::CreateChildMetaPipeline
                       (pMVar2,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                        in_stack_ffffffffffffffcf);
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
               in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    ::std::reference_wrapper::operator_cast_to_PhysicalOperator_
              ((reference_wrapper<duckdb::PhysicalOperator> *)0x79fe1b);
    MetaPipeline::Build(pMVar2,(PhysicalOperator *)in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

void PhysicalOperator::BuildPipelines(Pipeline &current, MetaPipeline &meta_pipeline) {
	op_state.reset();

	auto &state = meta_pipeline.GetState();
	if (IsSink()) {
		// operator is a sink, build a pipeline
		sink_state.reset();
		D_ASSERT(children.size() == 1);

		// single operator: the operator becomes the data source of the current pipeline
		state.SetPipelineSource(current, *this);

		// we create a new pipeline starting from the child
		auto &child_meta_pipeline = meta_pipeline.CreateChildMetaPipeline(current, *this);
		child_meta_pipeline.Build(children[0]);
	} else {
		// operator is not a sink! recurse in children
		if (children.empty()) {
			// source
			state.SetPipelineSource(current, *this);
		} else {
			if (children.size() != 1) {
				throw InternalException("Operator not supported in BuildPipelines");
			}
			state.AddPipelineOperator(current, *this);
			children[0].get().BuildPipelines(current, meta_pipeline);
		}
	}
}